

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O0

void __thiscall ParserTest_Factor_Test::TestBody(ParserTest_Factor_Test *this)

{
  __single_object node;
  unique_ptr<Node,_std::default_delete<Node>_> *in_stack_000002e0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_000002e8;
  string *in_stack_000002f0;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffd28;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffd30;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *puVar1;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffd38;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *__u;
  unique_ptr<Node,_std::default_delete<Node>_> *in_stack_fffffffffffffd40;
  unique_ptr<Node,_std::default_delete<Node>_> *this_00;
  offset_in_Parser_to_subr *in_stack_fffffffffffffd48;
  offset_in_Parser_to_subr *__f;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_fffffffffffffd50;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *this_01;
  allocator<char> *in_stack_fffffffffffffd60;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd68;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  *in_stack_fffffffffffffd78;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *__args_2;
  BinaryOperator *in_stack_fffffffffffffd80;
  allocator<char> *__args_1;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  *in_stack_fffffffffffffd88;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> local_260;
  code *local_258;
  undefined8 local_250;
  undefined8 local_221;
  undefined4 local_1fc;
  undefined4 local_1ec;
  undefined4 local_1dc;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> local_1c8;
  undefined1 local_1c0 [16];
  _Manager_type local_1b0;
  offset_in_Parser_to_subr local_1a8 [4];
  allocator<char> local_181;
  string local_180 [36];
  undefined4 local_15c;
  undefined4 local_14c;
  undefined4 local_13c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_e9;
  string local_e8 [36];
  undefined4 local_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> local_a8 [2];
  code *local_98;
  undefined8 local_90;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> local_88 [4];
  allocator<char> local_61;
  string local_60 [52];
  undefined4 local_2c;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffd48);
  local_20 = 2;
  local_2c = 3;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffd48);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffd30);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  local_98 = Parser::parseFactor;
  local_90 = 0;
  puVar1 = local_88;
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  setupTest(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(in_stack_fffffffffffffd40);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cb55c);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  local_b4 = 5;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffd48);
  local_b8 = 3;
  local_c4 = 3;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffd48);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)puVar1,
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  __args_2 = local_a8;
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::operator=
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffd30);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffd30);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffd30);
  __args_1 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  local_128._M_string_length = (size_type)Parser::parseFactor;
  local_128.field_2._M_allocated_capacity = 0;
  __s = (char *)((long)&local_128.field_2 + 8);
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  this_02 = &local_128;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  setupTest(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(in_stack_fffffffffffffd40);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cb6d9);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_13c = 1;
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])puVar1);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>>
            ((UnaryOperator *)__args_2,
             (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)this_02);
  local_14c = 2;
  local_15c = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffd48);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<UnaryNode,std::default_delete<UnaryNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)puVar1,
             (BinaryOperator *)__args_1,__args_2);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::operator=
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffd30);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffd30);
  std::unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_>::~unique_ptr
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)in_stack_fffffffffffffd30);
  std::unique_ptr<VariableNode,_std::default_delete<VariableNode>_>::~unique_ptr
            ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)
             in_stack_fffffffffffffd30);
  __a = &local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,__s,__a);
  local_1c0._8_8_ = Parser::parseFactor;
  local_1b0 = (_Manager_type)0x0;
  __f = local_1a8;
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (in_stack_fffffffffffffd50,__f);
  this_01 = (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_1c0;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  setupTest(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(in_stack_fffffffffffffd40);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cb881);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])puVar1);
  local_1dc = 3;
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])puVar1);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>,BinaryOperator,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>>
            ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)puVar1,
             (BinaryOperator *)__args_1,
             (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)__args_2);
  local_1ec = 2;
  local_1fc = 2;
  std::make_unique<NumericLiteralNode,int>((int *)__f);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            (puVar1,(BinaryOperator *)__args_1,__args_2);
  __u = &local_1c8;
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::operator=
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffd30);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffd30);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffd30);
  std::unique_ptr<VariableNode,_std::default_delete<VariableNode>_>::~unique_ptr
            ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)
             in_stack_fffffffffffffd30);
  std::unique_ptr<VariableNode,_std::default_delete<VariableNode>_>::~unique_ptr
            ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)
             in_stack_fffffffffffffd30);
  this_00 = (unique_ptr<Node,_std::default_delete<Node>_> *)&local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,__s,__a);
  local_258 = Parser::parseFactor;
  local_250 = 0;
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (this_01,__f);
  puVar1 = &local_260;
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>,void>(this_00,__u);
  setupTest(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(this_00);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cba4c);
  std::__cxx11::string::~string((string *)((long)&local_221 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr(puVar1);
  return;
}

Assistant:

TEST(ParserTest, Factor)
{
  auto node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2), 
      BinaryOperator::Multiplication, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("2 * 3", &Parser::parseFactor, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(5), 
      BinaryOperator::Division, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("5 / 3", &Parser::parseFactor, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<UnaryNode>(UnaryOperator::Minus, std::make_unique<VariableNode>("x")), 
      BinaryOperator::Multiplication, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("-x * 2", &Parser::parseFactor, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(std::make_unique<VariableNode>("y"), BinaryOperator::Division, std::make_unique<VariableNode>("x")), 
      BinaryOperator::Multiplication, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("y / x * 2", &Parser::parseFactor, std::move(node));
}